

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj-design.c
# Opt level: O3

void final_check(artifact *art,object *obj)

{
  int iVar1;
  _Bool *p_Var2;
  _Bool *p_Var3;
  activation **ppaVar4;
  bitflag *flags_00;
  _Bool _Var5;
  bool bVar6;
  short sVar7;
  long lVar8;
  _Bool **pp_Var9;
  effect_object_property *p;
  int iVar10;
  ulong uVar11;
  element_info *el_info;
  element_info *peVar12;
  int *piVar13;
  int16_t *piVar14;
  _Bool **pp_Var15;
  effect_object_property *peVar16;
  bitflag *flags;
  wchar_t unsummarized_count;
  int local_34;
  
  flags_00 = obj->flags;
  piVar14 = obj->modifiers;
  if (art != (artifact *)0x0) {
    piVar14 = art->modifiers;
    flags_00 = art->flags;
  }
  uVar11 = 0;
  do {
    if (uVar11 < 5) {
      if (piVar14[uVar11] < 0) {
        flag_off(flags_00,6,(int)uVar11 + 1);
      }
LAB_0018f14e:
      sVar7 = piVar14[uVar11];
      if (5 < sVar7) {
        sVar7 = 6;
      }
      piVar14[uVar11] = sVar7;
    }
    else if (uVar11 != 9) goto LAB_0018f14e;
    uVar11 = uVar11 + 1;
  } while (uVar11 != 0x11);
  peVar12 = art->el_info;
  if (art == (artifact *)0x0) {
    peVar12 = obj->el_info;
  }
  lVar8 = 0;
  do {
    if (peVar12[lVar8].res_level < 100) {
      peVar12[lVar8].flags = peVar12[lVar8].flags | 2;
    }
    lVar8 = lVar8 + 1;
  } while (lVar8 != 4);
  if ((0 < piVar14[5]) && (_Var5 = flag_has_dbg(flags_00,6,0x1e,"flags","OF_AGGRAVATE"), _Var5)) {
    piVar14[5] = 0;
  }
  if ((0 < piVar14[0xd]) && (_Var5 = flag_has_dbg(flags_00,6,0x2b,"flags","OF_DARKNESS"), _Var5)) {
    piVar14[0xd] = 0;
  }
  ppaVar4 = &obj->activation;
  pp_Var9 = &obj->brands;
  if (art != (artifact *)0x0) {
    pp_Var9 = &art->brands;
    ppaVar4 = &art->activation;
  }
  pp_Var15 = &obj->slays;
  if (art != (artifact *)0x0) {
    pp_Var15 = &art->slays;
  }
  if (*ppaVar4 != (activation *)0x0) {
    p_Var2 = *pp_Var9;
    p_Var3 = *pp_Var15;
    p = effect_summarize_properties((*ppaVar4)->effect,&local_34);
    if (local_34 < 1) {
      peVar16 = p;
      if (p != (effect_object_property *)0x0) {
        do {
          switch(peVar16->kind) {
          case EFPROP_OBJECT_FLAG_EXACT:
          case EFPROP_CURE_FLAG:
          case EFPROP_CONFLICT_FLAG:
            bVar6 = flag_has_dbg(flags_00,6,peVar16->idx,"flags","pcurr->idx");
            break;
          default:
            goto switchD_0018f2b4_caseD_1;
          case EFPROP_RESIST:
          case EFPROP_CONFLICT_RESIST:
          case EFPROP_CONFLICT_VULN:
            bVar6 = true;
            if (peVar16->reslevel_min <= (int)peVar12[peVar16->idx].res_level) {
              bVar6 = peVar16->reslevel_max < (int)peVar12[peVar16->idx].res_level;
            }
            break;
          case EFPROP_BRAND:
            if (p_Var2 == (_Bool *)0x0) {
LAB_0018f41f:
              bVar6 = true;
            }
            else {
              iVar10 = 1;
              if (1 < (ulong)z_info->brand_max) {
                piVar13 = &brands[1].multiplier;
                uVar11 = 1;
                do {
                  if (((p_Var2[uVar11] == true) && (piVar13[-2] == brands[peVar16->idx].resist_flag)
                      ) && (iVar10 < *piVar13)) {
                    iVar10 = *piVar13;
                  }
                  uVar11 = uVar11 + 1;
                  piVar13 = piVar13 + 0xc;
                } while (z_info->brand_max != uVar11);
              }
              bVar6 = brands[peVar16->idx].multiplier <= iVar10;
            }
            break;
          case EFPROP_SLAY:
            if (p_Var3 == (_Bool *)0x0) goto LAB_0018f41f;
            iVar10 = 1;
            if (1 < z_info->slay_max) {
              uVar11 = 1;
              lVar8 = 100;
              do {
                if (((p_Var3[uVar11] == true) &&
                    (_Var5 = same_monsters_slain((wchar_t)uVar11,peVar16->idx), _Var5)) &&
                   (iVar1 = *(int *)((long)&slays->code + lVar8), iVar10 < iVar1)) {
                  iVar10 = iVar1;
                }
                uVar11 = uVar11 + 1;
                lVar8 = lVar8 + 0x38;
              } while (uVar11 < z_info->slay_max);
            }
            bVar6 = slays[peVar16->idx].multiplier <= iVar10;
          }
          if ((peVar16->next == (effect_object_property *)0x0) ||
             (peVar16 = peVar16->next, bVar6 == false)) goto switchD_0018f2b4_caseD_1;
        } while( true );
      }
    }
    else {
switchD_0018f2b4_caseD_1:
      while (p != (effect_object_property *)0x0) {
        peVar16 = p->next;
        mem_free(p);
        p = peVar16;
      }
    }
  }
  return;
}

Assistant:

static void final_check(struct artifact *art, struct object *obj)
{
	bitflag *flags = art ? art->flags : obj->flags;
	int16_t *modifiers = art ? art->modifiers : obj->modifiers;
	struct element_info *el_info = art ? art->el_info : obj->el_info;
	int i;

	/* Limit modifiers, remove sustains if a stat modifier is negative */
	for (i = 0; i < OBJ_MOD_MAX; i++) {
		if ((i < STAT_MAX) && (modifiers[i] < 0)) {
			of_off(flags, i + 1);
		}
		if (i != OBJ_MOD_SPEED) {
			modifiers[i] = MIN(modifiers[i], 6);
		}
	}

	/* Low resist means object is proof against that element */
	for (i = 0; i < ELEM_BASE_MAX; i++) {
		if (el_info[i].res_level < RES_LEVEL_BASE) {
			el_info[i].flags |= EL_INFO_IGNORE;
		}
	}

	/* Remove contradictory properties */
	if ((modifiers[OBJ_MOD_STEALTH] > 0) && of_has(flags, OF_AGGRAVATE)) {
		modifiers[OBJ_MOD_STEALTH] = 0;
	}
	if ((modifiers[OBJ_MOD_LIGHT] > 0) && of_has(flags, OF_DARKNESS)) {
		modifiers[OBJ_MOD_LIGHT] = 0;
	}
	remove_contradictory_activation(art, obj);
}